

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

double __thiscall
soplex::SPxScaler<double>::getCoefUnscaled
          (SPxScaler<double> *this,SPxLPBase<double> *lp,int row,int col)

{
  double dVar1;
  
  dVar1 = SVectorBase<double>::operator[]
                    ((SVectorBase<double> *)
                     ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[col].idx),
                     row);
  dVar1 = ldexp(dVar1,-((lp->super_LPRowSetBase<double>).scaleExp.data[row] +
                       (lp->super_LPColSetBase<double>).scaleExp.data[col]));
  return dVar1;
}

Assistant:

R SPxScaler<R>::getCoefUnscaled(const SPxLPBase<R>& lp, int row, int col) const
{
   assert(lp.isScaled());
   assert(row < lp.nRows());
   assert(col < lp.nCols());

   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;

   return spxLdexp(lp.colVector(col)[row], - rowscaleExp[row] - colscaleExp[col]);
}